

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint32_t *histogram_symbols,WebPPicture *pic,
              int percent_range,int *percent)

{
  uint i;
  undefined8 *puVar1;
  VP8LHistogram **ppVVar2;
  ulong uVar3;
  ulong uVar4;
  VP8LHistogram *pVVar5;
  byte bVar6;
  PixOrCopyBlock *pPVar7;
  undefined8 uVar8;
  uint64_t uVar9;
  PixOrCopy *pPVar10;
  int tmp;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  VP8LHistogramSet *pVVar16;
  ushort *puVar17;
  long lVar18;
  int64_t iVar19;
  void *pvVar20;
  VP8LBackwardRefs *pVVar21;
  uint uVar22;
  ulong uVar23;
  bool bVar24;
  ushort uVar25;
  int iVar26;
  ulong uVar27;
  uint *puVar28;
  ulong uVar29;
  HistogramPair *pair;
  PixOrCopy *v;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ushort *__s;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  short sVar39;
  ushort uVar40;
  int iVar41;
  VP8LBackwardRefs *pVVar42;
  VP8LHistogram *pVVar43;
  uint32_t uVar44;
  int64_t iVar45;
  VP8LHistogram **ppVVar46;
  ulong uVar47;
  short sVar48;
  long lVar49;
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int num_used;
  int local_1a4;
  VP8LHistogram *local_1a0;
  VP8LBackwardRefs *local_198;
  int local_18c;
  ushort *local_188;
  int local_17c;
  VP8LHistogram **local_178;
  uint64_t cost;
  int local_168;
  int local_164;
  VP8LHistogram *local_160;
  ulong local_158;
  ulong local_150;
  VP8LHistogramSet *local_148;
  int local_140;
  int local_13c;
  VP8LRefsCursor local_138 [11];
  
  bVar6 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    uVar47 = 1;
  }
  else {
    iVar26 = 1 << (bVar6 & 0x1f);
    uVar47 = (ulong)(((ysize + iVar26) - 1U >> (bVar6 & 0x1f)) *
                    ((xsize + iVar26) - 1U >> (bVar6 & 0x1f)));
  }
  iVar26 = (int)uVar47;
  local_1a4 = low_effort;
  local_198 = refs;
  pVVar16 = VP8LAllocateHistogramSet(iVar26,cache_bits);
  local_150 = 0x40;
  if (local_1a4 != 0) {
    local_150 = 4;
  }
  puVar17 = (ushort *)WebPSafeMalloc((ulong)(uint)(iVar26 * 2),2);
  num_used = iVar26;
  local_188 = puVar17;
  local_148 = pVVar16;
  if (puVar17 == (ushort *)0x0 || pVVar16 == (VP8LHistogramSet *)0x0) goto LAB_0013b07a;
  local_160 = tmp_histo;
  local_178 = (VP8LHistogram **)0x1;
  local_1a0 = (VP8LHistogram *)pVVar16->histograms;
  local_17c = quality;
  local_158 = uVar47;
  VP8LRefsCursorInit(local_138,local_198);
  VP8LHistogramSetClear(pVVar16);
  iVar41 = 0;
  iVar26 = 0;
  while (pPVar10 = local_138[0].cur_pos, local_138[0].cur_pos != (PixOrCopy *)0x0) {
    VP8LHistogramAddSinglePixOrCopy
              (*(VP8LHistogram **)
                ((long)local_1a0 +
                (long)(int)((iVar26 >> (bVar6 & 0x1f)) +
                           (iVar41 >> (bVar6 & 0x1f)) *
                           ((xsize + (1 << (bVar6 & 0x1f))) - 1U >> (bVar6 & 0x1f))) * 8),
               local_138[0].cur_pos,(_func_int_int_int *)0x0,0);
    iVar26 = iVar26 + (uint)pPVar10->len;
    while (xsize <= iVar26) {
      iVar41 = iVar41 + 1;
      iVar26 = iVar26 - xsize;
    }
    VP8LRefsCursorNext(local_138);
  }
  local_138[0].cur_pos = (PixOrCopy *)(local_158 & 0xffffffff);
  local_1a0 = (VP8LHistogram *)local_148->histograms;
  local_198 = (VP8LBackwardRefs *)image_histo->histograms;
  uVar44 = 0;
  pVVar16 = local_148;
  for (lVar49 = 0; lVar49 < pVVar16->max_size; lVar49 = lVar49 + 1) {
    pVVar43 = *(VP8LHistogram **)(local_1a0->red_ + lVar49 * 2 + -2);
    UpdateHistogramCost(pVVar43);
    if ((((pVVar43->is_used_[0] == '\0') && (pVVar43->is_used_[1] == '\0')) &&
        (pVVar43->is_used_[2] == '\0')) &&
       ((pVVar43->is_used_[3] == '\0' && (pVVar43->is_used_[4] == '\0')))) {
      HistogramSetRemoveHistogram(image_histo,(int)lVar49,&num_used);
      HistogramSetRemoveHistogram(pVVar16,(int)lVar49,(int *)local_138);
      uVar12 = 0xffffffff;
    }
    else {
      puVar1 = *(undefined8 **)(&local_198->block_size_ + lVar49 * 2);
      iVar26 = *(int *)(puVar1 + 0x195);
      iVar11 = (4 << ((byte)iVar26 & 0x1f)) + 0x1138;
      iVar41 = (1 << ((byte)iVar26 & 0x1f)) + 0x118;
      if (iVar26 < 1) {
        iVar41 = 0x118;
      }
      pvVar20 = (void *)*puVar1;
      if (iVar26 < 1) {
        iVar11 = 0x1138;
      }
      memcpy(puVar1,pVVar43,(long)iVar11);
      pVVar16 = local_148;
      *puVar1 = pvVar20;
      memcpy(pvVar20,pVVar43->literal_,(long)iVar41 << 2);
      uVar12 = uVar44;
      uVar44 = uVar44 + 1;
    }
    histogram_symbols[lVar49] = uVar12;
  }
  uVar29 = (ulong)(uint)num_used;
  iVar26 = (int)local_150 * 2;
  if (local_17c < 100 &&
      (num_used != iVar26 && SBORROW4(num_used,iVar26) == num_used + (int)local_150 * -2 < 0)) {
    if (local_17c < 0x5a) {
      iVar26 = (int)local_158;
      local_198 = (VP8LBackwardRefs *)
                  (ulong)((((uint)(iVar26 < 0x101) * 8 + 8 >> (0x200 < iVar26)) >> (0x400 < iVar26))
                         >> (local_17c < 0x33));
    }
    else {
      local_198 = (VP8LBackwardRefs *)&working_state_cur_put_buffer_simd;
    }
    ppVVar2 = image_histo->histograms;
    uVar22 = image_histo->size;
    uVar36 = 0;
    uVar23 = 0;
    if (0 < (int)uVar22) {
      uVar23 = (ulong)uVar22;
    }
    uVar27 = 0xffffffffffffffff;
    uVar30 = 0;
    uVar33 = 0;
    uVar35 = 0;
    uVar32 = uVar27;
    uVar34 = uVar27;
    for (; uVar23 != uVar36; uVar36 = uVar36 + 1) {
      pVVar43 = ppVVar2[uVar36];
      if (pVVar43 != (VP8LHistogram *)0x0) {
        uVar3 = pVVar43->literal_cost_;
        if (uVar35 <= uVar3) {
          uVar35 = uVar3;
        }
        uVar4 = pVVar43->red_cost_;
        if (uVar3 <= uVar34) {
          uVar34 = uVar3;
        }
        if (uVar33 <= uVar4) {
          uVar33 = uVar4;
        }
        if (uVar4 <= uVar32) {
          uVar32 = uVar4;
        }
        uVar3 = pVVar43->blue_cost_;
        if (uVar30 <= uVar3) {
          uVar30 = uVar3;
        }
        if (uVar3 <= uVar27) {
          uVar27 = uVar3;
        }
      }
    }
    lVar49 = uVar35 - uVar34;
    auVar51._8_4_ = (int)((ulong)lVar49 >> 0x20);
    auVar51._0_8_ = lVar49;
    auVar51._12_4_ = 0x45300000;
    lVar37 = uVar33 - uVar32;
    auVar52._8_4_ = (int)((ulong)lVar37 >> 0x20);
    auVar52._0_8_ = lVar37;
    auVar52._12_4_ = 0x45300000;
    lVar38 = uVar30 - uVar27;
    auVar53._8_4_ = (int)((ulong)lVar38 >> 0x20);
    auVar53._0_8_ = lVar38;
    auVar53._12_4_ = 0x45300000;
    for (uVar36 = 0; uVar23 != uVar36; uVar36 = uVar36 + 1) {
      pVVar43 = ppVVar2[uVar36];
      if (pVVar43 != (VP8LHistogram *)0x0) {
        uVar40 = 0;
        if (uVar35 != uVar34) {
          lVar50 = pVVar43->literal_cost_ - uVar34;
          auVar54._8_4_ = (int)((ulong)lVar50 >> 0x20);
          auVar54._0_8_ = lVar50;
          auVar54._12_4_ = 0x45300000;
          uVar40 = (ushort)(int)((((auVar54._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar50) - 4503599627370496.0)) *
                                 3.999999) /
                                ((auVar51._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)lVar49) - 4503599627370496.0)));
        }
        if (local_1a4 == 0) {
          sVar48 = 0;
          sVar39 = 0;
          if (uVar33 != uVar32) {
            lVar50 = pVVar43->red_cost_ - uVar32;
            auVar55._8_4_ = (int)((ulong)lVar50 >> 0x20);
            auVar55._0_8_ = lVar50;
            auVar55._12_4_ = 0x45300000;
            sVar39 = (short)((int)((((auVar55._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar50) - 4503599627370496.0))
                                   * 3.999999) /
                                  ((auVar52._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,(int)lVar37) - 4503599627370496.0)))
                            << 2);
          }
          if (uVar30 != uVar27) {
            lVar50 = pVVar43->blue_cost_ - uVar27;
            auVar56._8_4_ = (int)((ulong)lVar50 >> 0x20);
            auVar56._0_8_ = lVar50;
            auVar56._12_4_ = 0x45300000;
            sVar48 = (short)(int)((((auVar56._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar50) - 4503599627370496.0))
                                  * 3.999999) /
                                 ((auVar53._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar38) - 4503599627370496.0)));
          }
          uVar40 = sVar39 + uVar40 * 0x10 + sVar48;
        }
        local_188[uVar36] = uVar40;
      }
    }
    for (uVar23 = 0; (local_150 & 0xffffffff) != uVar23; uVar23 = uVar23 + 1) {
      *(undefined4 *)((long)&local_138[0].cur_pos + uVar23 * 4) = 0xffff;
    }
    for (uVar23 = 0; uVar29 != uVar23; uVar23 = uVar23 + 1) {
      puVar17[uVar47 + uVar23] = (ushort)uVar23;
    }
    __s = local_188;
    for (lVar49 = 0; lVar49 < (int)uVar22; lVar49 = lVar49 + 1) {
      pVVar43 = ppVVar2[lVar49];
      if (pVVar43 != (VP8LHistogram *)0x0) {
        uVar23 = (ulong)__s[lVar49];
        lVar37 = (long)*(short *)((long)&local_138[0].cur_pos + uVar23 * 4);
        if (lVar37 == -1) {
          *(short *)((long)&local_138[0].cur_pos + uVar23 * 4) = (short)lVar49;
        }
        else if (local_1a4 == 0) {
          lVar50 = pVVar43->bit_cost_ * (long)local_198;
          lVar38 = lVar50 + 0x32;
          if (lVar50 < 0) {
            lVar38 = lVar50 + -0x32;
          }
          local_1a0 = ppVVar2[lVar37];
          lVar31 = pVVar43->bit_cost_ + local_1a0->bit_cost_;
          lVar18 = lVar38 / -100 + lVar31;
          lVar50 = lVar18;
          if (0x7fffffffffffffff - lVar38 / -100 < lVar31) {
            lVar50 = 0x7fffffffffffffff;
          }
          if (99 < lVar38) {
            lVar50 = lVar18;
          }
          iVar26 = GetCombinedHistogramEntropy(local_1a0,pVVar43,lVar50,&cost);
          pVVar5 = local_160;
          __s = local_188;
          if (iVar26 != 0) {
            HistogramAdd(local_1a0,pVVar43,local_160);
            pVVar5->bit_cost_ = cost;
            pVVar5->palette_code_bits_ = local_1a0->palette_code_bits_;
            if (((pVVar5->trivial_symbol_ == 0xffffffff) &&
                ((ppVVar2[lVar49]->trivial_symbol_ != 0xffffffff ||
                 (ppVVar2[lVar37]->trivial_symbol_ != 0xffffffff)))) &&
               (uVar40 = *(ushort *)((long)&local_138[0].cur_pos + uVar23 * 4 + 2), uVar40 < 0x20))
            {
              *(ushort *)((long)&local_138[0].cur_pos + uVar23 * 4 + 2) = uVar40 + 1;
              __s = local_188;
            }
            else {
              pVVar43 = ppVVar2[lVar37];
              ppVVar2[lVar37] = local_160;
              HistogramSetRemoveHistogram(image_histo,(int)lVar49,&num_used);
              puVar17[uVar47 + histogram_symbols[lVar49]] = (ushort)histogram_symbols[lVar37];
              __s = local_188;
              local_160 = pVVar43;
            }
          }
        }
        else {
          HistogramAdd(pVVar43,ppVVar2[lVar37],ppVVar2[lVar37]);
          HistogramSetRemoveHistogram(image_histo,(int)lVar49,&num_used);
          puVar17[uVar47 + histogram_symbols[lVar49]] = (ushort)histogram_symbols[lVar37];
          __s = local_188;
        }
      }
      uVar22 = image_histo->size;
    }
    if (local_1a4 != 0) {
      for (lVar49 = 0; lVar49 < (int)uVar22; lVar49 = lVar49 + 1) {
        if (ppVVar2[lVar49] != (VP8LHistogram *)0x0) {
          UpdateHistogramCost(ppVVar2[lVar49]);
          uVar22 = image_histo->size;
          __s = local_188;
        }
      }
    }
    bVar24 = true;
    while (bVar24) {
      bVar24 = false;
      for (uVar23 = 0; uVar23 != uVar29; uVar23 = uVar23 + 1) {
        uVar40 = puVar17[uVar47 + uVar23];
        while( true ) {
          if (uVar40 == puVar17[uVar47 + uVar40]) break;
          uVar25 = puVar17[uVar47 + puVar17[uVar47 + uVar40]];
          puVar17[uVar47 + uVar40] = uVar25;
          uVar40 = uVar25;
        }
        if (uVar40 != puVar17[uVar47 + uVar23]) {
          puVar17[uVar47 + uVar23] = uVar40;
          bVar24 = true;
        }
      }
    }
    memset(__s,0,(long)image_histo->max_size * 2);
    uVar40 = 0;
    for (uVar29 = 0; uVar29 < (uint)image_histo->max_size; uVar29 = uVar29 + 1) {
      if ((ulong)histogram_symbols[uVar29] != 0xffffffff) {
        uVar23 = (ulong)puVar17[uVar47 + histogram_symbols[uVar29]];
        if (uVar23 == 0) {
          uVar25 = *local_188;
        }
        else {
          uVar25 = local_188[uVar23];
          if (uVar25 == 0) {
            uVar25 = uVar40 + 1;
            local_188[uVar23] = uVar25;
            uVar40 = uVar25;
          }
        }
        histogram_symbols[uVar29] = (uint)uVar25;
      }
    }
    if (local_1a4 == 0) {
      uVar29 = (ulong)(uint)num_used;
      goto LAB_0013a944;
    }
LAB_0013aedc:
    RemoveEmptyHistograms(image_histo);
    local_178 = local_148->histograms;
    ppVVar2 = image_histo->histograms;
    local_1a0 = (VP8LHistogram *)(long)image_histo->size;
    pVVar42 = (VP8LBackwardRefs *)0x0;
    if (0 < image_histo->max_size) {
      pVVar42 = (VP8LBackwardRefs *)(ulong)(uint)image_histo->max_size;
    }
    if ((long)local_1a0 < 2) {
      for (pVVar21 = (VP8LBackwardRefs *)0x0; pVVar42 != pVVar21;
          pVVar21 = (VP8LBackwardRefs *)((long)&pVVar21->block_size_ + 1)) {
        histogram_symbols[(long)pVVar21] = 0;
      }
    }
    else {
      local_198 = pVVar42;
      for (pVVar21 = (VP8LBackwardRefs *)0x0; pVVar21 != pVVar42;
          pVVar21 = (VP8LBackwardRefs *)((long)&pVVar21->block_size_ + 1)) {
        if (local_178[(long)pVVar21] == (VP8LHistogram *)0x0) {
          histogram_symbols[(long)pVVar21] =
               histogram_symbols[(long)((long)&pVVar21[-1].last_block_ + 7)];
        }
        else {
          uVar47 = 0;
          lVar49 = 0x7fffffffffffffff;
          for (pVVar43 = (VP8LHistogram *)0x0; local_1a0 != pVVar43;
              pVVar43 = (VP8LHistogram *)((long)&pVVar43->literal_ + 1)) {
            pVVar5 = ppVVar2[(long)pVVar43];
            lVar37 = pVVar5->bit_cost_ + lVar49;
            lVar38 = lVar37;
            if (0x7fffffffffffffff - lVar49 < (long)pVVar5->bit_cost_) {
              lVar38 = 0x7fffffffffffffff;
            }
            if (lVar49 < 0) {
              lVar38 = lVar37;
            }
            iVar26 = GetCombinedHistogramEntropy
                               (pVVar5,local_178[(long)pVVar21],lVar38,(uint64_t *)local_138);
            if (iVar26 != 0) {
              lVar49 = (long)local_138[0].cur_pos - pVVar5->bit_cost_;
              uVar47 = (ulong)pVVar43 & 0xffffffff;
            }
          }
          histogram_symbols[(long)pVVar21] = (uint32_t)uVar47;
          pVVar42 = local_198;
        }
      }
    }
    VP8LHistogramSetClear(image_histo);
    image_histo->size = (int)local_1a0;
    for (pVVar21 = (VP8LBackwardRefs *)0x0; pVVar42 != pVVar21;
        pVVar21 = (VP8LBackwardRefs *)((long)&pVVar21->block_size_ + 1)) {
      if (local_178[(long)pVVar21] != (VP8LHistogram *)0x0) {
        pVVar43 = ppVVar2[(int)histogram_symbols[(long)pVVar21]];
        HistogramAdd(local_178[(long)pVVar21],pVVar43,pVVar43);
      }
    }
    WebPReportProgress(pic,percent_range + *percent,percent);
  }
  else {
LAB_0013a944:
    local_17c = local_17c * local_17c * local_17c;
    lVar37 = (long)(local_17c * 99);
    lVar49 = lVar37 + -500000;
    if (-1 < local_17c) {
      lVar49 = lVar37 + 500000;
    }
    local_160 = (VP8LHistogram *)(lVar49 / 1000000);
    iVar26 = (int)uVar29;
    local_17c = iVar26 / 2;
    if ((int)local_160 < iVar26) {
      ppVVar2 = image_histo->histograms;
      local_1a0 = (VP8LHistogram *)WebPSafeMalloc((long)iVar26,4);
      if (local_1a0 != (VP8LHistogram *)0x0) {
        local_13c = HistoQueueInit((HistoQueue *)&cost,9);
        if (local_13c != 0) {
          local_140 = (int)local_160 + 1;
          iVar41 = 0;
          for (lVar49 = 0; lVar49 < image_histo->size; lVar49 = lVar49 + 1) {
            if (ppVVar2[lVar49] != (VP8LHistogram *)0x0) {
              lVar37 = (long)iVar41;
              iVar41 = iVar41 + 1;
              local_1a0->red_[lVar37 + -2] = (uint32_t)lVar49;
            }
          }
          uVar47 = 0;
          iVar41 = 0;
          if (0 < iVar26) {
            iVar41 = iVar26;
          }
          local_158 = CONCAT44(local_158._4_4_,iVar41);
          iVar26 = 0;
          while( true ) {
            iVar41 = (int)uVar29;
            if (((iVar26 == (int)local_158) || (iVar41 <= (int)local_160)) ||
               (uVar22 = (int)uVar47 + 1, local_17c <= (int)uVar22)) break;
            if (local_168 == 0) {
              iVar45 = 0;
            }
            else {
              iVar45 = *(int64_t *)(cost + 8);
            }
            local_18c = 1;
            local_198 = (VP8LBackwardRefs *)CONCAT44(local_198._4_4_,iVar41 + -1);
            local_1a4 = iVar26;
            local_150 = (ulong)uVar22;
            for (iVar11 = 0; (1 < iVar41 && (iVar11 < iVar41 / 2)); iVar11 = iVar11 + 1) {
              local_178 = (VP8LHistogram **)
                          ((((ulong)local_178 & 0xffffffff) * 0xbc8f) % 0x7fffffff);
              uVar23 = (ulong)local_178 % (ulong)(uint)((iVar41 + -1) * iVar41);
              uVar47 = uVar23 / ((ulong)local_198 & 0xffffffff);
              uVar22 = (uint)(uVar23 % ((ulong)local_198 & 0xffffffff));
              iVar19 = HistoQueuePush((HistoQueue *)&cost,ppVVar2,local_1a0->red_[uVar47 - 2],
                                      local_1a0->red_
                                      [(ulong)((uVar22 + 1) - (uint)(uVar22 < (uint)uVar47)) - 2],
                                      iVar45);
              if ((iVar19 < 0) && (local_168 == local_164)) break;
              if (iVar19 < 0) {
                iVar45 = iVar19;
              }
            }
            iVar26 = local_168;
            uVar9 = cost;
            pVVar43 = local_1a0;
            uVar47 = local_150;
            if (local_168 != 0) {
              iVar11 = *(int *)cost;
              local_18c = *(int *)(cost + 4);
              pvVar20 = bsearch(&local_18c,local_1a0,(long)iVar41,4,PairComparison);
              memmove(pvVar20,(void *)((long)pvVar20 + 4),
                      (((ulong)~((long)pvVar20 - (long)pVVar43) >> 2) + (long)iVar41) * 4);
              HistogramAdd(ppVVar2[local_18c],ppVVar2[iVar11],ppVVar2[iVar11]);
              ppVVar2[iVar11]->bit_cost_ = *(uint64_t *)(uVar9 + 0x10);
              HistogramSetRemoveHistogram(image_histo,local_18c,&num_used);
              local_198 = (VP8LBackwardRefs *)(uVar9 - 0x18);
              iVar41 = 0;
              do {
                pair = (HistogramPair *)((long)iVar41 * 0x18 + uVar9);
                while( true ) {
                  if (iVar26 <= iVar41) {
                    uVar29 = (ulong)(uint)num_used;
                    uVar47 = 0;
                    local_168 = iVar26;
                    goto LAB_0013acb3;
                  }
                  iVar15 = pair->idx1;
                  iVar13 = pair->idx2;
                  if ((iVar15 == local_18c || iVar15 == iVar11) &&
                     (iVar13 == local_18c || iVar13 == iVar11)) break;
                  if (iVar15 != local_18c && iVar15 != iVar11) {
                    bVar24 = true;
                    if (iVar13 == local_18c || iVar13 == iVar11) {
                      pair->idx2 = iVar11;
                      bVar24 = false;
                      iVar13 = iVar11;
                    }
                  }
                  else {
                    pair->idx1 = iVar11;
                    bVar24 = false;
                    iVar15 = iVar11;
                  }
                  iVar14 = iVar15;
                  if (iVar13 < iVar15) {
                    pair->idx2 = iVar15;
                    pair->idx1 = iVar13;
                    iVar14 = iVar13;
                    iVar13 = iVar15;
                  }
                  if ((!bVar24) &&
                     (iVar15 = HistoQueueUpdatePair(ppVVar2[iVar14],ppVVar2[iVar13],0,pair),
                     iVar15 == 0)) break;
                  if (pair->cost_diff < *(long *)(uVar9 + 8)) {
                    local_138[0].last_pos_ = *(PixOrCopy **)(uVar9 + 0x10);
                    local_138[0].cur_pos = *(PixOrCopy **)uVar9;
                    local_138[0].cur_block_ = *(PixOrCopyBlock **)(uVar9 + 8);
                    *(uint64_t *)(uVar9 + 0x10) = pair->cost_combo;
                    iVar45 = pair->cost_diff;
                    *(undefined8 *)uVar9 = *(undefined8 *)pair;
                    *(int64_t *)(uVar9 + 8) = iVar45;
                    pair->cost_combo = (uint64_t)local_138[0].last_pos_;
                    *(PixOrCopy **)pair = local_138[0].cur_pos;
                    pair->cost_diff = (int64_t)local_138[0].cur_block_;
                  }
                  iVar41 = iVar41 + 1;
                  pair = pair + 1;
                }
                pair->cost_combo = (uint64_t)(&local_198->tail_)[(long)iVar26 * 3];
                pPVar7 = *(PixOrCopyBlock **)(&local_198->block_size_ + (long)iVar26 * 6 + 2);
                *(undefined8 *)pair = *(undefined8 *)(&local_198->block_size_ + (long)iVar26 * 6);
                pair->cost_diff = (int64_t)pPVar7;
                iVar26 = iVar26 + -1;
              } while( true );
            }
LAB_0013acb3:
            iVar26 = local_1a4 + 1;
          }
          uVar29 = (ulong)(local_140 < iVar41);
        }
        WebPSafeFree((void *)cost);
        WebPSafeFree(local_1a0);
        if (local_13c != 0) {
          if ((uVar29 & 1) != 0) goto LAB_0013aedc;
          goto LAB_0013acf7;
        }
      }
    }
    else {
LAB_0013acf7:
      RemoveEmptyHistograms(image_histo);
      uVar22 = image_histo->size;
      ppVVar2 = image_histo->histograms;
      iVar26 = HistoQueueInit((HistoQueue *)&cost,uVar22 * uVar22);
      if (iVar26 != 0) {
        ppVVar46 = (VP8LHistogram **)0x0;
        local_178 = (VP8LHistogram **)0x0;
        if (0 < (int)uVar22) {
          local_178 = (VP8LHistogram **)(ulong)uVar22;
        }
        lVar49 = 1;
        for (; ppVVar46 != local_178; ppVVar46 = (VP8LHistogram **)((long)ppVVar46 + 1)) {
          lVar37 = lVar49;
          if (image_histo->histograms[(long)ppVVar46] != (VP8LHistogram *)0x0) {
            for (; (int)lVar37 < (int)uVar22; lVar37 = lVar37 + 1) {
              if (image_histo->histograms[lVar37] != (VP8LHistogram *)0x0) {
                HistoQueuePush((HistoQueue *)&cost,ppVVar2,(int)ppVVar46,(int)lVar37,0);
              }
            }
          }
          lVar49 = lVar49 + 1;
        }
        while (iVar26 = local_168, uVar9 = cost, 0 < local_168) {
          uVar22 = *(uint *)cost;
          i = *(uint *)(cost + 4);
          HistogramAdd(ppVVar2[(int)i],ppVVar2[(int)uVar22],ppVVar2[(int)uVar22]);
          ppVVar2[(int)uVar22]->bit_cost_ = *(uint64_t *)(uVar9 + 0x10);
          HistogramSetRemoveHistogram(image_histo,i,&num_used);
          iVar41 = 0;
LAB_0013add7:
          puVar28 = (uint *)((long)iVar41 * 0x18 + uVar9);
          for (; iVar41 < iVar26; iVar41 = iVar41 + 1) {
            if ((((*puVar28 == uVar22) || (puVar28[1] == i)) || (*puVar28 == i)) ||
               (puVar28[1] == uVar22)) goto LAB_0013ae55;
            if (*(long *)(puVar28 + 2) < *(long *)(uVar9 + 8)) {
              local_138[0].last_pos_ = *(PixOrCopy **)(uVar9 + 0x10);
              local_138[0].cur_pos = *(PixOrCopy **)uVar9;
              local_138[0].cur_block_ = *(PixOrCopyBlock **)(uVar9 + 8);
              *(undefined8 *)(uVar9 + 0x10) = *(undefined8 *)(puVar28 + 4);
              uVar8 = *(undefined8 *)(puVar28 + 2);
              *(undefined8 *)uVar9 = *(undefined8 *)puVar28;
              *(undefined8 *)(uVar9 + 8) = uVar8;
              *(PixOrCopy **)(puVar28 + 4) = local_138[0].last_pos_;
              *(PixOrCopy **)puVar28 = local_138[0].cur_pos;
              *(PixOrCopyBlock **)(puVar28 + 2) = local_138[0].cur_block_;
            }
            puVar28 = puVar28 + 6;
          }
          local_168 = iVar26;
          for (uVar47 = 0; (long)uVar47 < (long)image_histo->size; uVar47 = uVar47 + 1) {
            if ((uVar22 != uVar47) && (image_histo->histograms[uVar47] != (VP8LHistogram *)0x0)) {
              HistoQueuePush((HistoQueue *)&cost,image_histo->histograms,uVar22,(int)uVar47,0);
            }
          }
        }
        WebPSafeFree((void *)cost);
        goto LAB_0013aedc;
      }
      WebPSafeFree((void *)cost);
    }
LAB_0013b07a:
    WebPEncodingSetError(pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  WebPSafeFree(local_148);
  WebPSafeFree(local_188);
  return (int)(pic->error_code == VP8_ENC_OK);
LAB_0013ae55:
  *(undefined8 *)(puVar28 + 4) = *(undefined8 *)((uVar9 - 8) + (long)iVar26 * 0x18);
  puVar1 = (undefined8 *)((uVar9 - 0x18) + (long)iVar26 * 0x18);
  uVar8 = puVar1[1];
  *(undefined8 *)puVar28 = *puVar1;
  *(undefined8 *)(puVar28 + 2) = uVar8;
  iVar26 = iVar26 + -1;
  goto LAB_0013add7;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs, int quality,
                             int low_effort, int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint32_t* const histogram_symbols,
                             const WebPPicture* const pic, int percent_range,
                             int* const percent) {
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      (uint16_t*)WebPSafeMalloc(2 * image_histo_raw_size, sizeof(*map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const int32_t combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(
        image_histo, &num_used, histogram_symbols, cluster_mappings, tmp_histo,
        bin_map, entropy_combine_num_bins, combine_cost_factor, low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size =
        (int)(1 + DivRound(quality * quality * quality * (MAX_HISTO_GREEDY - 1),
                           100 * 100 * 100));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  if (!WebPReportProgress(pic, *percent + percent_range, percent)) {
    goto Error;
  }

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return (pic->error_code == VP8_ENC_OK);
}